

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O0

void Min_SopDist1Merge(Min_Man_t *p)

{
  int iVar1;
  Min_Cube_t *pMVar2;
  int local_2c;
  int i;
  Min_Cube_t *pCubeNew;
  Min_Cube_t *pCube2;
  Min_Cube_t *pCube;
  Min_Man_t *p_local;
  
  local_2c = p->nVars;
  do {
    if (local_2c < 0) {
      return;
    }
    for (pCube2 = p->ppStore[local_2c]; pCube2 != (Min_Cube_t *)0x0; pCube2 = pCube2->pNext) {
      for (pCubeNew = pCube2->pNext; pCubeNew != (Min_Cube_t *)0x0; pCubeNew = pCubeNew->pNext) {
        if (*(uint *)&pCube2->field_0x8 >> 0x16 != *(uint *)&pCubeNew->field_0x8 >> 0x16) {
          __assert_fail("pCube->nLits == pCube2->nLits",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinSop.c"
                        ,0x1f7,"void Min_SopDist1Merge(Min_Man_t *)");
        }
        iVar1 = Min_CubesDistOne(pCube2,pCubeNew,(Min_Cube_t *)0x0);
        if (iVar1 != 0) {
          pMVar2 = Min_CubesXor(p,pCube2,pCubeNew);
          if (*(uint *)&pMVar2->field_0x8 >> 0x16 != (*(uint *)&pCube2->field_0x8 >> 0x16) - 1) {
            __assert_fail("pCubeNew->nLits == pCube->nLits - 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinSop.c"
                          ,0x1fb,"void Min_SopDist1Merge(Min_Man_t *)");
          }
          pMVar2->pNext = p->ppStore[*(uint *)&pMVar2->field_0x8 >> 0x16];
          p->ppStore[*(uint *)&pMVar2->field_0x8 >> 0x16] = pMVar2;
          p->nCubes = p->nCubes + 1;
        }
      }
    }
    local_2c = local_2c + -1;
  } while( true );
}

Assistant:

void Min_SopDist1Merge( Min_Man_t * p )
{
    Min_Cube_t * pCube, * pCube2, * pCubeNew;
    int i;
    for ( i = p->nVars; i >= 0; i-- )
    {
        Min_CoverForEachCube( p->ppStore[i], pCube )
        Min_CoverForEachCube( pCube->pNext, pCube2 )
        {
            assert( pCube->nLits == pCube2->nLits );
            if ( !Min_CubesDistOne( pCube, pCube2, NULL ) )
                continue;
            pCubeNew = Min_CubesXor( p, pCube, pCube2 );
            assert( pCubeNew->nLits == pCube->nLits - 1 );
            pCubeNew->pNext = p->ppStore[pCubeNew->nLits];
            p->ppStore[pCubeNew->nLits] = pCubeNew;
            p->nCubes++;
        }
    }
}